

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::~IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this)

{
  ~IfcDimensionCurveTerminator
            ((IfcDimensionCurveTerminator *)
             &this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
              super_IfcAnnotationOccurrence.super_IfcStyledItem.Name);
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}